

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

string * __thiscall
tinyusdz::ascii::AsciiParser::GetWarning_abi_cxx11_
          (string *__return_storage_ptr__,AsciiParser *this)

{
  ostream *poVar1;
  _Elt_pointer pEVar2;
  ErrorDiagnostic diag;
  stringstream ss;
  ErrorDiagnostic local_1e0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if ((this->warn_stack).c.
      super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->warn_stack).c.
      super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    while (pEVar2 = (this->warn_stack).c.
                    super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur,
          pEVar2 != (this->warn_stack).c.
                    super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pEVar2 == (this->warn_stack).c.
                    super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pEVar2 = (this->warn_stack).c.
                 super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
      }
      ErrorDiagnostic::ErrorDiagnostic(&local_1e0,pEVar2 + -1);
      poVar1 = ::std::operator<<(local_1a8,"USDA source near line ");
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,local_1e0.cursor.row + 1);
      poVar1 = ::std::operator<<(poVar1,", col ");
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,local_1e0.cursor.col + 1);
      ::std::operator<<(poVar1,": ");
      ::std::operator<<(local_1a8,(string *)&local_1e0);
      ::std::
      deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
      ::pop_back(&(this->warn_stack).c);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AsciiParser::GetWarning() {
  if (warn_stack.empty()) {
    return std::string();
  }

  std::stringstream ss;
  while (!warn_stack.empty()) {
    ErrorDiagnostic diag = warn_stack.top();

    ss << "USDA source near line " << (diag.cursor.row + 1) << ", col "
       << (diag.cursor.col + 1) << ": ";
    ss << diag.err;  // assume message contains newline.

    warn_stack.pop();
  }

  return ss.str();
}